

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_string_parser.cpp
# Opt level: O2

string * __thiscall
ICM::to_string_abi_cxx11_(string *__return_storage_ptr__,ICM *this,MatchResult *mr)

{
  MatchType type;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  to_string_abi_cxx11_(&local_30,(ICM *)(ulong)*(uint *)this,type);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  Parser::MatchResult::getString_abi_cxx11_(&local_30,(MatchResult *)this);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string to_string(const Parser::MatchResult &mr) {
		// Main
		string str;
		str.append("(");
		str.append(ICM::to_string(mr.getType()));
		str.append(", \'");
		str.append(mr.getString());
		str.append("')");
		return str;
	}